

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  size_t sVar1;
  uchar uVar2;
  ulong uVar3;
  uchar uVar4;
  
  for (sVar1 = 0;
      ((uVar3 = (ulong)(byte)first[sVar1], uVar3 != 0 && ((ulong)(byte)second[sVar1] != 0)) &&
      (max != sVar1)); sVar1 = sVar1 + 1) {
    uVar2 = ""[uVar3];
    uVar4 = ""[(byte)second[sVar1]];
    if (uVar2 != uVar4) goto LAB_00447562;
  }
  if (max == sVar1) {
    return 1;
  }
  uVar2 = ""[uVar3];
  uVar4 = ""[(byte)second[sVar1]];
LAB_00447562:
  return (int)(uVar2 == uVar4);
}

Assistant:

int Curl_strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}